

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::ub::Uniform::Uniform(Uniform *this,char *name,VarType *type,deUint32 flags)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_19);
  (this->m_type).m_type = TYPE_LAST;
  *(undefined8 *)&(this->m_type).m_flags = 0;
  *(undefined8 *)((long)&(this->m_type).m_data.array.elementType + 4) = 0;
  VarType::operator=(&this->m_type,type);
  this->m_flags = flags;
  return;
}

Assistant:

Uniform::Uniform (const char* name, const VarType& type, deUint32 flags)
	: m_name	(name)
	, m_type	(type)
	, m_flags	(flags)
{
}